

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache_test.cpp
# Opt level: O3

void __thiscall BufferCache_Basics_Test::~BufferCache_Basics_Test(BufferCache_Basics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BufferCache, Basics) {
    ASSERT_FALSE(intBufferCache == nullptr);

    std::vector<int> v{1,2,3,4,5};

    EXPECT_EQ(0, intBufferCache->BytesUsed());

    const int *ptr = intBufferCache->LookupOrAdd(v);
    for (size_t i = 0; i < v.size(); ++i)
        EXPECT_EQ(ptr[i], v[i]);

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    EXPECT_EQ(ptr, intBufferCache->LookupOrAdd(v));

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    std::vector<int> v2{1,2,3,4};
    const int *ptr2 = intBufferCache->LookupOrAdd(v2);
    EXPECT_NE(ptr, ptr2);
    for (size_t i = 0; i < v2.size(); ++i)
        EXPECT_EQ(ptr2[i], v2[i]);

    EXPECT_EQ(9 * sizeof(int), intBufferCache->BytesUsed());
}